

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# decode.c
# Opt level: O1

int aec_decode_range(aec_stream_conflict *strm,size_t *rsi_offsets,size_t rsi_offsets_count,
                    size_t pos,size_t size)

{
  uint uVar1;
  internal_state_conflict *piVar2;
  bool bVar3;
  int iVar4;
  uchar *__ptr;
  uint32_t uVar5;
  long lVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  aec_stream_conflict *paVar10;
  aec_stream_conflict *paVar11;
  ulong uVar12;
  bool bVar13;
  aec_stream_conflict local_78;
  
  piVar2 = strm->state;
  paVar10 = strm;
  paVar11 = &local_78;
  for (lVar6 = 9; lVar6 != 0; lVar6 = lVar6 + -1) {
    paVar11->next_in = paVar10->next_in;
    paVar10 = (aec_stream_conflict *)&paVar10->avail_in;
    paVar11 = (aec_stream_conflict *)((long)paVar11 + 8);
  }
  if (piVar2->pp == 0) {
    piVar2->ref = 0;
    uVar5 = strm->block_size;
  }
  else {
    piVar2->ref = 1;
    uVar5 = strm->block_size - 1;
  }
  piVar2->encoded_block_size = uVar5;
  piVar2->rsip = piVar2->rsi_buffer;
  piVar2->flush_start = piVar2->rsi_buffer;
  piVar2->bitp = 0;
  piVar2->fs = 0;
  piVar2->mode = m_id;
  uVar1 = piVar2->bytes_per_sample;
  uVar7 = (ulong)(uVar1 * strm->block_size * strm->rsi);
  if (rsi_offsets_count <= pos / uVar7) {
    return -3;
  }
  local_78.total_out = 0;
  uVar8 = size + pos % uVar7 + 1;
  local_78.avail_out = ((ulong)uVar1 - uVar8 % (ulong)uVar1) + uVar8;
  __ptr = (uchar *)malloc(local_78.avail_out);
  if (__ptr == (uchar *)0x0) {
    return -4;
  }
  uVar8 = rsi_offsets[pos / uVar7];
  uVar12 = uVar8 >> 3;
  iVar4 = -4;
  bVar3 = false;
  uVar9 = local_78.avail_in - uVar12;
  if (uVar12 <= local_78.avail_in) {
    paVar10 = (aec_stream_conflict *)((long)(uchar **)local_78.next_in + uVar12);
    if ((uVar8 & 7) != 0) {
      bVar3 = false;
      bVar13 = local_78.avail_in == uVar12;
      local_78.next_in = (uchar *)paVar10;
      local_78.avail_in = uVar9;
      if (bVar13) goto LAB_001047cd;
      (local_78.state)->acc = (ulong)*(byte *)&paVar10->next_in;
      (local_78.state)->bitp = 8 - ((uint)uVar8 & 7);
      paVar10 = (aec_stream_conflict *)((long)&paVar10->next_in + 1);
      uVar9 = uVar9 - 1;
    }
    local_78.avail_in = uVar9;
    bVar3 = true;
    iVar4 = 0;
    local_78.next_in = (uchar *)paVar10;
  }
LAB_001047cd:
  if ((bVar3) && (local_78.next_out = __ptr, iVar4 = aec_decode(&local_78,(int)paVar10), iVar4 == 0)
     ) {
    memcpy(strm->next_out,__ptr + pos % uVar7,size);
    strm->next_out = strm->next_out + size;
    strm->avail_out = strm->avail_out - size;
    strm->total_out = strm->total_out + size;
    free(__ptr);
    iVar4 = 0;
  }
  return iVar4;
}

Assistant:

int aec_decode_range(struct aec_stream *strm, const size_t *rsi_offsets, size_t rsi_offsets_count, size_t pos, size_t size)
{
    struct internal_state *state = strm->state;
    int status;
    size_t rsi_size;
    size_t rsi_n;
    unsigned char *out_tmp;
    struct aec_stream strm_tmp = *strm;

    if (state->pp) {
        state->ref = 1;
        state->encoded_block_size = strm->block_size - 1;
    } else {
        state->ref = 0;
        state->encoded_block_size = strm->block_size;
    }

    state->rsip = state->rsi_buffer;
    state->flush_start = state->rsi_buffer;
    state->bitp = 0;
    state->fs = 0;
    state->mode = m_id;

    rsi_size = strm->rsi * strm->block_size * state->bytes_per_sample;
    rsi_n = pos / rsi_size;
    if (rsi_n >= rsi_offsets_count)
        return AEC_DATA_ERROR;

    /* resize and align to bytes_per_sample */
    strm_tmp.total_out = 0;
    strm_tmp.avail_out = size + pos % rsi_size + 1;
    strm_tmp.avail_out += state->bytes_per_sample - strm_tmp.avail_out % state->bytes_per_sample;
    if ((out_tmp = malloc(strm_tmp.avail_out)) == NULL)
        return AEC_MEM_ERROR;
    strm_tmp.next_out = out_tmp;

    if ((status = aec_buffer_seek(&strm_tmp, rsi_offsets[rsi_n])) != AEC_OK)
        return status;

    if ((status = aec_decode(&strm_tmp, AEC_FLUSH)) != 0)
        return status;

    memcpy(strm->next_out, out_tmp + (pos - rsi_n * rsi_size), size);

    strm->next_out += size;
    strm->avail_out -= size;
    strm->total_out += size;
    free(out_tmp);

    return AEC_OK;
}